

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_decompress.c
# Opt level: O0

size_t ZSTD_decompress_insertDictionary(ZSTD_DCtx *dctx,void *dict,size_t dictSize)

{
  U32 UVar1;
  uint uVar2;
  size_t code;
  ulong in_RDX;
  void *in_RSI;
  ZSTD_DCtx *in_RDI;
  size_t eSize;
  U32 magic;
  size_t in_stack_00000128;
  void *in_stack_00000130;
  ZSTD_entropyDTables_t *in_stack_00000138;
  void *in_stack_ffffffffffffffc8;
  size_t local_8;
  
  if (in_RDX < 8) {
    local_8 = ZSTD_refDictContent(in_RDI,in_RSI,in_RDX);
  }
  else {
    UVar1 = MEM_readLE32(in_stack_ffffffffffffffc8);
    if (UVar1 == 0xec30a437) {
      UVar1 = MEM_readLE32(in_stack_ffffffffffffffc8);
      in_RDI->dictID = UVar1;
      code = ZSTD_loadEntropy(in_stack_00000138,in_stack_00000130,in_stack_00000128);
      uVar2 = ERR_isError(code);
      if (uVar2 == 0) {
        in_RDI->fseEntropy = 1;
        in_RDI->litEntropy = 1;
        local_8 = ZSTD_refDictContent(in_RDI,(void *)((long)in_RSI + code),in_RDX - code);
      }
      else {
        local_8 = 0xffffffffffffffe2;
      }
    }
    else {
      local_8 = ZSTD_refDictContent(in_RDI,in_RSI,in_RDX);
    }
  }
  return local_8;
}

Assistant:

static size_t ZSTD_decompress_insertDictionary(ZSTD_DCtx* dctx, const void* dict, size_t dictSize)
{
    if (dictSize < 8) return ZSTD_refDictContent(dctx, dict, dictSize);
    {   U32 const magic = MEM_readLE32(dict);
        if (magic != ZSTD_MAGIC_DICTIONARY) {
            return ZSTD_refDictContent(dctx, dict, dictSize);   /* pure content mode */
    }   }
    dctx->dictID = MEM_readLE32((const char*)dict + ZSTD_frameIdSize);

    /* load entropy tables */
    {   size_t const eSize = ZSTD_loadEntropy(&dctx->entropy, dict, dictSize);
        if (ZSTD_isError(eSize)) return ERROR(dictionary_corrupted);
        dict = (const char*)dict + eSize;
        dictSize -= eSize;
    }
    dctx->litEntropy = dctx->fseEntropy = 1;

    /* reference dictionary content */
    return ZSTD_refDictContent(dctx, dict, dictSize);
}